

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::setWidget(QMdiSubWindow *this,QWidget *widget)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  QWidget *pQVar10;
  QLayout *this_01;
  QObject *pQVar11;
  int __sig;
  QMdiSubWindow *pQVar12;
  long in_FS_OFFSET;
  QLatin1StringView s;
  undefined1 local_60 [8];
  undefined1 local_58 [32];
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (widget == (QWidget *)0x0) {
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
      QMdiSubWindowPrivate::removeBaseWidget(this_00);
      return;
    }
    goto LAB_0041a472;
  }
  pDVar1 = (this_00->baseWidget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar10 = (QWidget *)0x0;
  }
  else {
    pQVar10 = (QWidget *)(this_00->baseWidget).wp.value;
  }
  if (pQVar10 == widget) {
    local_58._0_4_ = 2;
    local_58._20_4_ = 0;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._24_8_ = "default";
    QMessageLogger::warning(local_58,"QMdiSubWindow::setWidget: widget is already set");
  }
  else {
    bVar6 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized);
    QMdiSubWindowPrivate::removeBaseWidget(this_00);
    this_01 = QWidget::layout(&this->super_QWidget);
    if (this_01 == (QLayout *)0x0) {
      QWidget::setParent(widget,&this->super_QWidget);
    }
    else {
      QLayout::addWidget(this_01,widget);
    }
    __sig = 1;
    pQVar11 = (QObject *)
              QObject::findChild<QSizeGrip*>(&widget->super_QObject,(FindChildOptions)0x1);
    if (pQVar11 != (QObject *)0x0) {
      pQVar12 = this;
      QObject::installEventFilter(pQVar11);
      __sig = (int)pQVar12;
    }
    bVar7 = QPointer::operator_cast_to_bool((QPointer *)&this_00->sizeGrip);
    if (bVar7) {
      QWidget::raise((QWidget *)(this_00->sizeGrip).wp.value,__sig);
    }
    QWeakPointer<QObject>::assign<QObject>(&(this_00->baseWidget).wp,&widget->super_QObject);
    QObject::installEventFilter((this_00->baseWidget).wp.value);
    this_00->ignoreWindowTitleChange = true;
    bVar7 = QWidget::isWindowModified(&this->super_QWidget);
    QWidget::windowTitle((QString *)local_58,&this->super_QWidget);
    lVar5 = CONCAT44(local_58._20_4_,local_58._16_4_);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    if (lVar5 == 0) {
      QMdiSubWindowPrivate::updateWindowTitle(this_00,true);
      bVar7 = QWidget::isWindowModified((QWidget *)(this_00->baseWidget).wp.value);
    }
    bVar8 = QWidget::isWindowModified(&this->super_QWidget);
    if ((!bVar8) && (bVar7 != false)) {
      QWidget::windowTitle((QString *)local_58,&this->super_QWidget);
      s.m_data = "[*]";
      s.m_size = 3;
      bVar8 = QString::contains((QString *)local_58,s,CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
      if (bVar8) {
        QWidget::setWindowModified(&this->super_QWidget,bVar7);
      }
    }
    QWidget::windowTitle((QString *)local_58,(QWidget *)(this_00->baseWidget).wp.value);
    pDVar3 = (this_00->lastChildWindowTitle).d.d;
    pcVar4 = (this_00->lastChildWindowTitle).d.ptr;
    (this_00->lastChildWindowTitle).d.d = (Data *)CONCAT44(local_58._4_4_,local_58._0_4_);
    (this_00->lastChildWindowTitle).d.ptr = (char16_t *)CONCAT44(local_58._12_4_,local_58._8_4_);
    local_58._0_4_ = SUB84(pDVar3,0);
    local_58._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
    local_58._8_4_ = SUB84(pcVar4,0);
    local_58._12_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
    qVar2 = (this_00->lastChildWindowTitle).d.size;
    (this_00->lastChildWindowTitle).d.size = CONCAT44(local_58._20_4_,local_58._16_4_);
    local_58._16_4_ = (undefined4)qVar2;
    local_58._20_4_ = (undefined4)((ulong)qVar2 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    this_00->ignoreWindowTitleChange = false;
    QWidget::windowIcon((QWidget *)local_58);
    cVar9 = QIcon::isNull();
    if (cVar9 == '\0') {
LAB_0041a3f4:
      QIcon::~QIcon((QIcon *)local_58);
    }
    else {
      QWidget::windowIcon((QWidget *)local_60);
      cVar9 = QIcon::isNull();
      QIcon::~QIcon((QIcon *)local_60);
      QIcon::~QIcon((QIcon *)local_58);
      if (cVar9 == '\0') {
        QWidget::windowIcon((QWidget *)local_58);
        QWidget::setWindowIcon(&this->super_QWidget,(QIcon *)local_58);
        goto LAB_0041a3f4;
      }
    }
    QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
    if ((!bVar6) && (bVar6 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized), bVar6))
    {
      QWidget::setAttribute(&this->super_QWidget,WA_Resized,false);
    }
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0041a472:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::setWidget(QWidget *widget)
{
    Q_D(QMdiSubWindow);
    if (!widget) {
        d->removeBaseWidget();
        return;
    }

    if (Q_UNLIKELY(widget == d->baseWidget)) {
        qWarning("QMdiSubWindow::setWidget: widget is already set");
        return;
    }

    bool wasResized = testAttribute(Qt::WA_Resized);
    d->removeBaseWidget();

    if (QLayout *layout = this->layout())
        layout->addWidget(widget);
    else
        widget->setParent(this);

#if QT_CONFIG(sizegrip)
    QSizeGrip *sizeGrip = widget->findChild<QSizeGrip *>();
    if (sizeGrip)
        sizeGrip->installEventFilter(this);
    if (d->sizeGrip)
        d->sizeGrip->raise();
#endif

    d->baseWidget = widget;
    d->baseWidget->installEventFilter(this);

    d->ignoreWindowTitleChange = true;
    bool isWindowModified = this->isWindowModified();
    if (windowTitle().isEmpty()) {
        d->updateWindowTitle(true);
        isWindowModified = d->baseWidget->isWindowModified();
    }
    if (!this->isWindowModified() && isWindowModified && windowTitle().contains("[*]"_L1))
        setWindowModified(isWindowModified);
    d->lastChildWindowTitle = d->baseWidget->windowTitle();
    d->ignoreWindowTitleChange = false;

    if (windowIcon().isNull() && !d->baseWidget->windowIcon().isNull())
        setWindowIcon(d->baseWidget->windowIcon());

    d->updateGeometryConstraints();
    if (!wasResized && testAttribute(Qt::WA_Resized))
        setAttribute(Qt::WA_Resized, false);
}